

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkPipelineShaderStageCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineShaderStageCreateInfo>
          (Impl *this,VkPipelineShaderStageCreateInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkPipelineShaderStageCreateInfo *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkPipelineShaderStageCreateInfo *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkPipelineShaderStageCreateInfo>(alloc,count);
    if (this_local != (Impl *)0x0) {
      std::copy<VkPipelineShaderStageCreateInfo_const*,VkPipelineShaderStageCreateInfo*>
                (src,src + count,(VkPipelineShaderStageCreateInfo *)this_local);
    }
  }
  return (VkPipelineShaderStageCreateInfo *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}